

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::rebuildVariableUseCounts(soul::AST::ModuleBase&)::UseCounter::visit(soul::AST
::PreOrPostIncOrDec__(void *this,PreOrPostIncOrDec *p)

{
  byte bVar1;
  byte bVar2;
  bool oldReading;
  bool oldWriting;
  PreOrPostIncOrDec *p_local;
  UseCounter *this_local;
  
  bVar1 = *(byte *)((long)this + 9);
  bVar2 = *(byte *)((long)this + 8);
  *(undefined1 *)((long)this + 8) = 1;
  *(undefined1 *)((long)this + 9) = 1;
  ASTVisitor::visit((ASTVisitor *)this,p);
  *(byte *)((long)this + 9) = bVar1 & 1;
  *(byte *)((long)this + 8) = bVar2 & 1;
  return;
}

Assistant:

void visit (AST::PreOrPostIncOrDec& p) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = true;
                isWriting = true;
                ASTVisitor::visit (p);
                isWriting = oldWriting;
                isReading = oldReading;
            }